

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> * __thiscall
docopt::Command::single_match
          (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *__return_storage_ptr__,
          Command *this,PatternList *left)

{
  bool bVar1;
  int iVar2;
  __shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  undefined4 extraout_var;
  value *v2;
  undefined4 extraout_var_00;
  LeafPattern *local_f8;
  value local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  value local_68;
  LeafPattern *local_40;
  Argument *arg;
  size_t size;
  size_t i;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *local_20;
  PatternList *left_local;
  Command *this_local;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *ret;
  
  i._7_1_ = 0;
  local_20 = left;
  left_local = (PatternList *)this;
  this_local = (Command *)__return_storage_ptr__;
  std::pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_>::
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>,_true>(__return_storage_ptr__);
  size = 0;
  arg = (Argument *)
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::size(local_20);
  while( true ) {
    if (arg <= size) {
      return __return_storage_ptr__;
    }
    this_00 = &std::
               vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ::operator[](local_20,size)->
               super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>;
    peVar3 = std::__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    if (peVar3 == (element_type *)0x0) {
      local_f8 = (LeafPattern *)0x0;
    }
    else {
      local_f8 = (LeafPattern *)__dynamic_cast(peVar3,&Pattern::typeinfo,&Argument::typeinfo,0);
    }
    local_40 = local_f8;
    if (local_f8 != (LeafPattern *)0x0) break;
    size = size + 1;
  }
  iVar2 = (*(this->super_Argument).super_LeafPattern.super_Pattern._vptr_Pattern[3])();
  std::__cxx11::string::string((string *)&local_88,(string *)CONCAT44(extraout_var,iVar2));
  value::value(&local_68,&local_88);
  v2 = LeafPattern::getValue(local_40);
  bVar1 = docopt::operator==(&local_68,v2);
  value::~value(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->first = size;
  iVar2 = (*(this->super_Argument).super_LeafPattern.super_Pattern._vptr_Pattern[3])();
  value::value(&local_d0,true);
  std::make_shared<docopt::Command,std::__cxx11::string_const&,docopt::value>
            (&local_a8,(value *)CONCAT44(extraout_var_00,iVar2));
  std::shared_ptr<docopt::LeafPattern>::operator=
            (&__return_storage_ptr__->second,(shared_ptr<docopt::Command> *)&local_a8);
  std::shared_ptr<docopt::Command>::~shared_ptr((shared_ptr<docopt::Command> *)&local_a8);
  value::~value(&local_d0);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<size_t, std::shared_ptr<LeafPattern>> Command::single_match(PatternList const& left) const
	{
		std::pair<size_t, std::shared_ptr<LeafPattern>> ret {};

		for(size_t i = 0, size = left.size(); i < size; ++i)
		{
			auto arg = dynamic_cast<Argument const*>(left[i].get());
			if (arg) {
				if (name() == arg->getValue()) {
					ret.first = i;
					ret.second = std::make_shared<Command>(name(), value{true});
				}
				break;
			}
		}

		return ret;
	}